

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CB3DMeshFileLoader.cpp
# Opt level: O2

bool __thiscall irr::scene::CB3DMeshFileLoader::load(CB3DMeshFileLoader *this)

{
  undefined1 *this_00;
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  s32 sVar3;
  bool bVar4;
  long lVar5;
  double __x;
  double __x_00;
  SB3dChunkHeader header;
  SB3dChunk local_48;
  s32 fileVersion;
  
  this_00 = &(this->super_IMeshLoader).field_0x8;
  core::array<irr::scene::SB3dChunk>::clear((array<irr::scene::SB3dChunk> *)this_00);
  this->NormalsInFile = false;
  this->HasVertexColors = false;
  (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&header,8);
  if (header.name == (c8  [4])0x44334242) {
    iVar2 = (*this->B3DFile->_vptr_IReadFile[3])();
    local_48.startposition = CONCAT44(extraout_var,iVar2) + -8;
    sVar3 = header.size;
    if (header.size < 1) {
      sVar3 = 0;
    }
    local_48.length = sVar3 + 8;
    local_48.name[0] = header.name[0];
    local_48.name[1] = header.name[1];
    local_48.name[2] = header.name[2];
    local_48.name[3] = header.name[3];
    core::array<irr::scene::SB3dChunk>::push_back((array<irr::scene::SB3dChunk> *)this_00,&local_48)
    ;
    (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&fileVersion,4);
    do {
      while( true ) {
        lVar5 = *(long *)&(this->super_IMeshLoader).field_0x10;
        lVar5 = (long)*(int *)(lVar5 + -0xc) + *(long *)(lVar5 + -8);
        iVar2 = (*this->B3DFile->_vptr_IReadFile[3])();
        bVar4 = lVar5 <= CONCAT44(extraout_var_00,iVar2);
        if (lVar5 <= CONCAT44(extraout_var_00,iVar2)) {
          core::array<irr::scene::SB3dChunk>::clear((array<irr::scene::SB3dChunk> *)this_00);
          core::array<irr::video::S3DVertex2TCoords>::clear(&this->BaseVertices);
          core::array<int>::clear(&this->AnimatedVertices_VertexID);
          core::array<int>::clear(&this->AnimatedVertices_BufferID);
          core::array<irr::scene::SB3dMaterial>::clear(&this->Materials);
          core::array<irr::scene::SB3dTexture>::clear(&this->Textures);
          return bVar4;
        }
        (**this->B3DFile->_vptr_IReadFile)(this->B3DFile,&header,8);
        iVar2 = (*this->B3DFile->_vptr_IReadFile[3])();
        local_48.startposition = CONCAT44(extraout_var_01,iVar2) + -8;
        sVar3 = header.size;
        if (header.size < 1) {
          sVar3 = 0;
        }
        local_48.length = sVar3 + 8;
        local_48.name[0] = header.name[0];
        local_48.name[1] = header.name[1];
        local_48.name[2] = header.name[2];
        local_48.name[3] = header.name[3];
        core::array<irr::scene::SB3dChunk>::push_back
                  ((array<irr::scene::SB3dChunk> *)this_00,&local_48);
        iVar2 = *(int *)(*(long *)&(this->super_IMeshLoader).field_0x10 + -0x10);
        if (iVar2 == 0x45444f4e) break;
        if (iVar2 == 0x53555242) {
          readChunkBRUS(this);
        }
        else if (iVar2 == 0x53584554) {
          readChunkTEXS(this);
        }
        else {
          os::Printer::log((Printer *)"Unknown chunk found in mesh base - skipping",__x);
          lVar5 = *(long *)&(this->super_IMeshLoader).field_0x10;
          iVar2 = (*this->B3DFile->_vptr_IReadFile[1])
                            (this->B3DFile,(long)*(int *)(lVar5 + -0xc) + *(long *)(lVar5 + -8),0);
          if ((char)iVar2 == '\0') {
            return bVar4;
          }
          core::array<irr::scene::SB3dChunk>::erase
                    ((array<irr::scene::SB3dChunk> *)this_00,
                     (int)((ulong)(*(long *)&(this->super_IMeshLoader).field_0x10 -
                                  *(long *)&(this->super_IMeshLoader).field_0x8) >> 4) - 1);
        }
      }
      bVar1 = readChunkNODE(this,(SJoint *)0x0);
    } while (bVar1);
  }
  else {
    (*this->B3DFile->_vptr_IReadFile[4])();
    os::Printer::log(__x_00);
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CB3DMeshFileLoader::load()
{
	B3dStack.clear();

	NormalsInFile = false;
	HasVertexColors = false;

	//------ Get header ------

	SB3dChunkHeader header;
	B3DFile->read(&header, sizeof(header));
#ifdef __BIG_ENDIAN__
	header.size = os::Byteswap::byteswap(header.size);
#endif

	if (strncmp(header.name, "BB3D", 4) != 0) {
		os::Printer::log("File is not a b3d file. Loading failed (No header found)", B3DFile->getFileName(), ELL_ERROR);
		return false;
	}

	// Add main chunk...
	B3dStack.push_back(SB3dChunk(header, B3DFile->getPos() - 8));

	// Get file version, but ignore it, as it's not important with b3d files...
	s32 fileVersion;
	B3DFile->read(&fileVersion, sizeof(fileVersion));
#ifdef __BIG_ENDIAN__
	fileVersion = os::Byteswap::byteswap(fileVersion);
#endif

	//------ Read main chunk ------

	while ((B3dStack.getLast().startposition + B3dStack.getLast().length) > B3DFile->getPos()) {
		B3DFile->read(&header, sizeof(header));
#ifdef __BIG_ENDIAN__
		header.size = os::Byteswap::byteswap(header.size);
#endif
		B3dStack.push_back(SB3dChunk(header, B3DFile->getPos() - 8));

		if (strncmp(B3dStack.getLast().name, "TEXS", 4) == 0) {
			if (!readChunkTEXS())
				return false;
		} else if (strncmp(B3dStack.getLast().name, "BRUS", 4) == 0) {
			if (!readChunkBRUS())
				return false;
		} else if (strncmp(B3dStack.getLast().name, "NODE", 4) == 0) {
			if (!readChunkNODE((CSkinnedMesh::SJoint *)0))
				return false;
		} else {
			os::Printer::log("Unknown chunk found in mesh base - skipping");
			if (!B3DFile->seek(B3dStack.getLast().startposition + B3dStack.getLast().length))
				return false;
			B3dStack.erase(B3dStack.size() - 1);
		}
	}

	B3dStack.clear();

	BaseVertices.clear();
	AnimatedVertices_VertexID.clear();
	AnimatedVertices_BufferID.clear();

	Materials.clear();
	Textures.clear();

	return true;
}